

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Intercom_Control_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Intercom_Control_PDU *this)

{
  pointer pIVar1;
  ostream *poVar2;
  ostream *poVar3;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  ulong uVar4;
  char cVar5;
  pointer pIVar6;
  KString local_420;
  KString local_400;
  KString local_3e0;
  string local_3c0 [32];
  KString local_3a0;
  KString local_380;
  KString local_360;
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar2 = std::operator<<(local_1a8,(string *)&local_360);
  poVar2 = std::operator<<(poVar2,"-Intercom Control PDU-\n");
  poVar2 = std::operator<<(poVar2,"Control Type:                     ");
  DATA_TYPE::ENUMS::GetEnumAsStringControlType_abi_cxx11_
            (&local_380,(ENUMS *)(ulong)(byte)(this->super_Header).super_Header6.field_0x27,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_380);
  poVar2 = std::operator<<(poVar2,"\n");
  DATA_TYPE::CommunicationsChannelType::GetAsString_abi_cxx11_(&local_3a0,&this->m_CommChannelType);
  poVar2 = std::operator<<(poVar2,(string *)&local_3a0);
  poVar3 = std::operator<<(poVar2,"Source Entity:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_420,&this->m_SrcEnt);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar2 = (ostream *)(local_340 + 0x10);
  std::operator<<(poVar2,'\t');
  uVar4 = 0;
  while( true ) {
    uVar4 = uVar4 & 0xffff;
    if (local_420._M_string_length <= uVar4) break;
    cVar5 = local_420._M_dataplus._M_p[uVar4];
    if (local_420._M_string_length - 1 != uVar4 && cVar5 == '\n') {
      cVar5 = '\t';
      std::operator<<(poVar2,'\n');
    }
    std::operator<<(poVar2,cVar5);
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  poVar2 = std::operator<<(poVar3,local_3c0);
  poVar2 = std::operator<<(poVar2,"Source Communications Device ID:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16SrcCommDevID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Source Line ID:                   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8SrcLineID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Transmit Priority:                ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8TransmitPriority);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Transmit Line State:              ");
  DATA_TYPE::ENUMS::GetEnumAsStringTransmitLineState_abi_cxx11_
            ((KString *)local_340,(ENUMS *)(ulong)this->m_ui8TransmitLineState,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)local_340);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Command:                          ");
  DATA_TYPE::ENUMS::GetEnumAsStringLineStateCommand_abi_cxx11_
            (&local_3e0,(ENUMS *)(ulong)this->m_ui8Command,Value_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_3e0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Master Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_400,&this->m_MstrEntID);
  poVar2 = std::operator<<(poVar2,(string *)&local_400);
  poVar2 = std::operator<<(poVar2,"Master Communications Device ID:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16MstrCommDeviceID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Master Channel ID:                ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16MstrChannelID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Intercom Parameter Length:        ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  pIVar1 = (this->m_vICP).
           super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar6 = (this->m_vICP).
                super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar1; pIVar6 = pIVar6 + 1) {
    (*(pIVar6->super_DataTypeBase)._vptr_DataTypeBase[2])((string *)local_340,pIVar6);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Intercom_Control_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Intercom Control PDU-\n"
       << "Control Type:                     " << GetEnumAsStringControlType( m_ui8CtrlTyp ) << "\n"
       << m_CommChannelType.GetAsString()
       << "Source Entity:\n"
       << IndentString( m_SrcEnt.GetAsString(), 1 )
       << "Source Communications Device ID:  " << m_ui16SrcCommDevID                << "\n"
       << "Source Line ID:                   " << ( KUINT16 )m_ui8SrcLineID         << "\n"
       << "Transmit Priority:                " << ( KUINT16 )m_ui8TransmitPriority  << "\n"
       << "Transmit Line State:              " << GetEnumAsStringTransmitLineState( m_ui8TransmitLineState ) << "\n"
       << "Command:                          " << GetEnumAsStringLineStateCommand( m_ui8Command )            << "\n"
       << "Master Entity ID:\n"
       << m_MstrEntID.GetAsString()
       << "Master Communications Device ID:  " << m_ui16MstrCommDeviceID            << "\n"
       << "Master Channel ID:                " << m_ui16MstrChannelID               << "\n"
       << "Intercom Parameter Length:        " << m_ui32IntrParamLen                << "\n";

    vector<IntercomCommunicationParameters>::const_iterator citr = m_vICP.begin();
    vector<IntercomCommunicationParameters>::const_iterator citrEnd = m_vICP.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}